

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O2

void av1_update_and_record_txb_context
               (int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,
               void *arg)

{
  MACROBLOCKD *xd;
  tran_low_t *__dest;
  int *piVar1;
  char cVar2;
  byte bVar3;
  TX_CLASS tx_class;
  char cVar4;
  ushort eob;
  ushort uVar5;
  short sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int16_t *scan;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  char val;
  long lVar22;
  ulong uVar23;
  uint eob_00;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  SCAN_ORDER *scan_order;
  int iVar30;
  aom_cdf_prob *paVar31;
  long lVar32;
  macroblockd_plane *pd;
  undefined7 in_register_00000089;
  int8_t val_00;
  uint uVar33;
  tran_low_t *qcoeff;
  uint uVar34;
  long lVar35;
  byte *pbVar37;
  TXB_CTX txb_ctx;
  uint8_t levels_buf [1312];
  int8_t coeff_contexts [4096];
  ulong uVar36;
  
  uVar23 = CONCAT71(in_register_00000089,tx_size) & 0xffffffff;
  lVar7 = *arg;
  lVar8 = *(long *)((long)arg + 8);
  xd = (MACROBLOCKD *)(lVar8 + 0x1a0);
  lVar35 = (long)plane;
  lVar32 = lVar35 * 0xa30 + lVar8;
  pd = (macroblockd_plane *)(lVar32 + 0x1b0);
  lVar27 = (long)block;
  qcoeff = (tran_low_t *)((long)(block << 4) * 4 + *(long *)(lVar8 + 0x10 + lVar35 * 0x88));
  eob = *(ushort *)(*(long *)(lVar8 + 0x20 + lVar35 * 0x88) + lVar27 * 2);
  bVar14 = pd->plane_type;
  uVar29 = (ulong)bVar14;
  iVar20 = (int)CONCAT71(in_register_00000089,tx_size);
  bVar11 = av1_get_tx_type(xd,bVar14,blk_row,blk_col,tx_size,(uint)*(byte *)(lVar7 + 0x3c175));
  uVar26 = (ulong)bVar11;
  scan_order = (SCAN_ORDER *)((long)&av1_scan_orders[0][bVar11].scan + (ulong)(uint)(iVar20 << 8));
  eob_00 = (uint)eob;
  if (*(char *)((long)arg + 0x15) != '\0') goto LAB_008fd50a;
  lVar9 = **(long **)(lVar8 + 0x2058);
  get_txb_ctx(plane_bsize,tx_size,plane,
              (ENTROPY_CONTEXT *)((long)blk_col + *(long *)(lVar32 + 0x220)),
              (ENTROPY_CONTEXT *)((long)blk_row + *(long *)(lVar32 + 0x228)),&txb_ctx);
  iVar15 = get_txb_bhl(tx_size);
  iVar16 = get_txb_wide(tx_size);
  iVar17 = get_txb_high(tx_size);
  cVar2 = *(char *)((long)arg + 0x14);
  bVar11 = ""[uVar23];
  bVar3 = ""[uVar23];
  uVar18 = (uint)bVar3 + (uint)bVar11 + 1 >> 1;
  uVar34 = uVar18 & 0xff;
  uVar36 = (ulong)uVar34;
  lVar32 = *(long *)(lVar8 + 0x2b38);
  if (cVar2 != '\0') {
    update_cdf((aom_cdf_prob *)((long)txb_ctx.txb_skip_ctx * 6 + uVar36 * 0x4e + lVar32),eob == 0,2)
    ;
  }
  lVar22 = *(long *)(lVar8 + 0x4190);
  uVar24 = (ulong)(*(ushort *)(*(long *)(lVar8 + 0x4178) + 0x4e + uVar29 * 2) >> 4);
  lVar10 = *(long *)(lVar22 + 0x18 + lVar35 * 8);
  lVar25 = uVar24 + *(long *)(lVar22 + 0x30 + lVar35 * 8);
  *(char *)(lVar27 + lVar25) = (char)txb_ctx.txb_skip_ctx;
  *(ushort *)(uVar24 * 2 + lVar10 + lVar27 * 2) = eob;
  if (eob == 0) {
    av1_set_entropy_contexts(xd,pd,plane,plane_bsize,tx_size,0,blk_col,blk_row);
    return;
  }
  iVar19 = av1_get_tx_eob((segmentation *)(lVar7 + 0x409b8),*(ushort *)(lVar9 + 0xa7) & 7,tx_size);
  __dest = (tran_low_t *)
           ((ulong)*(ushort *)(*(long *)(lVar8 + 0x4178) + 0x4e + uVar29 * 2) * 4 +
            *(long *)(lVar22 + lVar35 * 8) + (long)(block << 4) * 4);
  memcpy(__dest,qcoeff,(long)iVar19 << 2);
  (*av1_txb_init_levels)(__dest,iVar16,iVar17,levels_buf);
  lVar35 = **(long **)(lVar8 + 0x2058);
  uVar5 = *(ushort *)(lVar35 + 0xa7);
  if ((char)uVar5 < '\0') {
    uVar28 = 1;
  }
  else {
    uVar28 = (uint)('\0' < *(char *)(lVar35 + 0x10));
  }
  if (plane < 1) {
    lVar9 = *(long *)(lVar8 + 0x2b38);
    bVar13 = *(byte *)(lVar7 + 0x3c175);
    bVar12 = av1_get_tx_type(xd,'\0',blk_row,blk_col,tx_size,(uint)bVar13);
    bVar13 = av1_get_ext_tx_set_type(tx_size,uVar28,(uint)bVar13);
    if (((bVar13 != 0) && (0 < *(int *)(lVar7 + 0x3c1e8))) && (*(char *)(lVar35 + 0x90) == '\0')) {
      if (((((segmentation *)(lVar7 + 0x409b8))->enabled == '\0') ||
          ((*(byte *)(lVar7 + 0x40a3c + (ulong)(uVar5 & 7) * 4) & 0x40) == 0)) &&
         (lVar22 = (long)ext_tx_set_index[uVar28][bVar13], 0 < lVar22)) {
        if (uVar28 == 0) {
          if (*(char *)(lVar35 + 0x5b) == '\0') {
            pbVar37 = (byte *)(lVar35 + 2);
          }
          else {
            pbVar37 = "" + *(byte *)(lVar35 + 0x5a);
          }
          if (cVar2 != '\0') {
            paVar31 = (aom_cdf_prob *)
                      ((ulong)*pbVar37 * 0x22 + lVar9 + (ulong)bVar11 * 0x1ba + lVar22 * 0x6e8 +
                      0x3b42);
            goto LAB_008fd5b0;
          }
        }
        else if (cVar2 != '\0') {
          paVar31 = (aom_cdf_prob *)((ulong)bVar11 * 0x22 + lVar9 + lVar22 * 0x88 + 0x4ffa);
LAB_008fd5b0:
          update_cdf(paVar31,(int8_t)av1_ext_tx_ind[bVar13][bVar12],av1_num_ext_tx_set[bVar13]);
        }
      }
    }
  }
  tx_class = ""[uVar26];
  scan = scan_order->scan;
  piVar1 = (int *)((ulong)(uint)(iVar20 << 6) + lVar8 + 0x256c8 + uVar26 * 4);
  *piVar1 = *piVar1 + 1;
  iVar20 = av1_get_eob_pos_token(eob_00,(int *)coeff_contexts);
  uVar26 = uVar26 - 10;
  switch(""[uVar23]) {
  case '\0':
    if (cVar2 != '\0') {
      paVar31 = (aom_cdf_prob *)((ulong)(uVar26 < 6) * 0xc + uVar29 * 0x18 + lVar32 + 0x3c6);
      iVar16 = 5;
LAB_008fd18a:
      update_cdf(paVar31,(char)iVar20 + -1,iVar16);
    }
    break;
  case '\x01':
    if (cVar2 != '\0') {
      paVar31 = (aom_cdf_prob *)((ulong)(uVar26 < 6) * 0xe + uVar29 * 0x1c + lVar32 + 0x3f6);
      iVar16 = 6;
      goto LAB_008fd18a;
    }
    break;
  case '\x02':
    if (cVar2 != '\0') {
      paVar31 = (aom_cdf_prob *)((ulong)(uVar26 < 6) * 0x10 + (ulong)bVar14 * 0x20 + lVar32 + 0x42e)
      ;
      iVar16 = 7;
      goto LAB_008fd18a;
    }
    break;
  case '\x03':
    if (cVar2 != '\0') {
      paVar31 = (aom_cdf_prob *)((ulong)(uVar26 < 6) * 0x12 + uVar29 * 0x24 + lVar32 + 0x46e);
      iVar16 = 8;
      goto LAB_008fd18a;
    }
    break;
  case '\x04':
    if (cVar2 != '\0') {
      paVar31 = (aom_cdf_prob *)((ulong)(uVar26 < 6) * 0x14 + uVar29 * 0x28 + lVar32 + 0x4b6);
      iVar16 = 9;
      goto LAB_008fd18a;
    }
    break;
  case '\x05':
    if (cVar2 != '\0') {
      paVar31 = (aom_cdf_prob *)((ulong)(uVar26 < 6) * 0x16 + uVar29 * 0x2c + lVar32 + 0x506);
      iVar16 = 10;
      goto LAB_008fd18a;
    }
    break;
  default:
    if (cVar2 != '\0') {
      paVar31 = (aom_cdf_prob *)((ulong)(uVar26 < 6) * 0x18 + uVar29 * 0x30 + lVar32 + 0x55e);
      iVar16 = 0xb;
      goto LAB_008fd18a;
    }
  }
  if ((cVar2 != '\0') && (0 < av1_eob_offset_bits[iVar20])) {
    update_cdf((aom_cdf_prob *)
               ((long)(iVar20 + -3) * 6 +
                uVar29 * 0x36 + (ulong)((uint)bVar11 + (uint)bVar3 + 1 >> 1 & 0xff) * 0x6c + lVar32
               + 0x186),((uint)coeff_contexts._0_4_ >>
                         ((byte)((char)av1_eob_offset_bits[iVar20] - 1) & 0x1f) & 1) != 0,2);
  }
  av1_get_nz_map_contexts_sse2(levels_buf,scan,eob,tx_size,tx_class,coeff_contexts);
  bVar11 = (byte)iVar15;
  iVar20 = 1 << (bVar11 & 0x1f);
  iVar15 = iVar20 + 4;
  uVar26 = uVar36;
  if (2 < (byte)uVar18) {
    uVar26 = 3;
  }
  for (uVar18 = eob_00 - 1; -1 < (int)uVar18; uVar18 = uVar18 - 1) {
    sVar6 = scan[uVar18];
    cVar4 = coeff_contexts[sVar6];
    uVar28 = qcoeff[sVar6];
    uVar33 = -uVar28;
    uVar21 = uVar28;
    if ((int)uVar28 < 1) {
      uVar21 = uVar33;
    }
    if (*(char *)(lVar7 + 0x9ae91) == '\x01') {
      *(long *)(lVar8 + 0x25d30) = *(long *)(lVar8 + 0x25d30) + (ulong)uVar21;
    }
    if (cVar2 != '\0') {
      uVar23 = 3;
      if (uVar21 < 3) {
        uVar23 = (ulong)uVar21;
      }
      val = (char)uVar23;
      if (uVar18 == eob_00 - 1) {
        paVar31 = (aom_cdf_prob *)
                  ((ulong)bVar14 * 0x20 + (ulong)(uVar34 << 6) + lVar32 + 0x5be + (long)cVar4 * 8);
        val = val + -1;
        iVar16 = 3;
      }
      else {
        paVar31 = (aom_cdf_prob *)
                  ((long)cVar4 * 10 + uVar29 * 0x1a4 + uVar36 * 0x348 + lVar32 + 0x6fe);
        iVar16 = 4;
      }
      update_cdf(paVar31,val,iVar16);
    }
    if (2 < uVar21) {
      iVar17 = (int)sVar6 >> (bVar11 & 0x1f);
      iVar19 = iVar17 << (bVar11 & 0x1f);
      iVar16 = sVar6 - iVar19;
      iVar30 = iVar17 * iVar15 + iVar16;
      lVar35 = (long)(iVar15 + iVar30);
      uVar21 = (uint)levels_buf[lVar35] + (uint)levels_buf[(long)iVar30 + 1];
      if (tx_class == '\x02') {
        uVar21 = uVar21 + levels_buf[(long)iVar30 + 2] + 1 >> 1;
        if (5 < uVar21) {
          uVar21 = 6;
        }
        if (sVar6 != 0) {
          if (sVar6 != iVar19) goto LAB_008fd41b;
LAB_008fd441:
          uVar21 = uVar21 + 7;
        }
      }
      else {
        if (tx_class == '\x01') {
          uVar21 = uVar21 + levels_buf[iVar30 + iVar20 * 2 + 8] + 1 >> 1;
          if (5 < uVar21) {
            uVar21 = 6;
          }
          if (sVar6 == 0) goto LAB_008fd444;
          if (iVar17 == 0) goto LAB_008fd441;
        }
        else if (tx_class == '\0') {
          uVar21 = uVar21 + levels_buf[lVar35 + 1] + 1 >> 1;
          if (5 < uVar21) {
            uVar21 = 6;
          }
          if (sVar6 == 0) goto LAB_008fd444;
          if (iVar17 < 2 && iVar16 < 2) goto LAB_008fd441;
        }
LAB_008fd41b:
        uVar21 = uVar21 + 0xe;
      }
LAB_008fd444:
      if (uVar28 != uVar33 && SBORROW4(uVar28,uVar33) == (int)(uVar28 * 2) < 0) {
        uVar33 = uVar28;
      }
      uVar28 = 0;
      do {
        if (0xb < uVar28) break;
        uVar33 = uVar33 - 3;
        if (cVar2 != '\0') {
          val_00 = '\x03';
          if ((int)uVar33 < 3) {
            val_00 = (int8_t)uVar33;
          }
          update_cdf((aom_cdf_prob *)
                     ((ulong)uVar21 * 10 + uVar29 * 0xd2 + uVar26 * 0x1a4 + lVar32 + 0x1766),val_00,
                     4);
        }
        uVar28 = uVar28 + 3;
      } while (2 < (int)uVar33);
    }
  }
  qcoeff = __dest;
  if (*__dest != 0) {
    if (cVar2 != '\0') {
      update_cdf((aom_cdf_prob *)((long)txb_ctx.dc_sign_ctx * 6 + lVar32 + uVar29 * 0x12 + 0x3a2),
                 (byte)((uint)*__dest >> 0x1f),2);
    }
    pbVar37 = (byte *)(lVar25 + lVar27);
    *pbVar37 = *pbVar37 | (char)txb_ctx.dc_sign_ctx << 4;
  }
LAB_008fd50a:
  bVar14 = av1_get_txb_entropy_context(qcoeff,scan_order,eob_00);
  av1_set_entropy_contexts(xd,pd,plane,plane_bsize,tx_size,(uint)bVar14,blk_col,blk_row);
  return;
}

Assistant:

void av1_update_and_record_txb_context(int plane, int block, int blk_row,
                                       int blk_col, BLOCK_SIZE plane_bsize,
                                       TX_SIZE tx_size, void *arg) {
  struct tokenize_b_args *const args = arg;
  const AV1_COMP *cpi = args->cpi;
  const AV1_COMMON *cm = &cpi->common;
  ThreadData *const td = args->td;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblock_plane *p = &x->plane[plane];
  struct macroblockd_plane *pd = &xd->plane[plane];
  const int eob = p->eobs[block];
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *qcoeff = p->qcoeff + block_offset;
  const PLANE_TYPE plane_type = pd->plane_type;
  const TX_TYPE tx_type =
      av1_get_tx_type(xd, plane_type, blk_row, blk_col, tx_size,
                      cm->features.reduced_tx_set_used);
  const SCAN_ORDER *const scan_order = get_scan(tx_size, tx_type);
  tran_low_t *tcoeff;
  assert(args->dry_run != DRY_RUN_COSTCOEFFS);
  if (args->dry_run == OUTPUT_ENABLED) {
    MB_MODE_INFO *mbmi = xd->mi[0];
    TXB_CTX txb_ctx;
    get_txb_ctx(plane_bsize, tx_size, plane,
                pd->above_entropy_context + blk_col,
                pd->left_entropy_context + blk_row, &txb_ctx);
    const int bhl = get_txb_bhl(tx_size);
    const int width = get_txb_wide(tx_size);
    const int height = get_txb_high(tx_size);
    const uint8_t allow_update_cdf = args->allow_update_cdf;
    const TX_SIZE txsize_ctx = get_txsize_entropy_ctx(tx_size);
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
#if CONFIG_ENTROPY_STATS
    int cdf_idx = cm->coef_cdf_category;
    ++td->counts->txb_skip[cdf_idx][txsize_ctx][txb_ctx.txb_skip_ctx][eob == 0];
#endif  // CONFIG_ENTROPY_STATS
    if (allow_update_cdf) {
      update_cdf(ec_ctx->txb_skip_cdf[txsize_ctx][txb_ctx.txb_skip_ctx],
                 eob == 0, 2);
    }

    CB_COEFF_BUFFER *cb_coef_buff = x->cb_coef_buff;
    const int txb_offset = x->mbmi_ext_frame->cb_offset[plane_type] /
                           (TX_SIZE_W_MIN * TX_SIZE_H_MIN);
    uint16_t *eob_txb = cb_coef_buff->eobs[plane] + txb_offset;
    uint8_t *const entropy_ctx = cb_coef_buff->entropy_ctx[plane] + txb_offset;
    entropy_ctx[block] = txb_ctx.txb_skip_ctx;
    eob_txb[block] = eob;

    if (eob == 0) {
      av1_set_entropy_contexts(xd, pd, plane, plane_bsize, tx_size, 0, blk_col,
                               blk_row);
      return;
    }
    const int segment_id = mbmi->segment_id;
    const int seg_eob = av1_get_tx_eob(&cpi->common.seg, segment_id, tx_size);
    tran_low_t *tcoeff_txb =
        cb_coef_buff->tcoeff[plane] + x->mbmi_ext_frame->cb_offset[plane_type];
    tcoeff = tcoeff_txb + block_offset;
    memcpy(tcoeff, qcoeff, sizeof(*tcoeff) * seg_eob);

    uint8_t levels_buf[TX_PAD_2D];
    uint8_t *const levels = set_levels(levels_buf, height);
    av1_txb_init_levels(tcoeff, width, height, levels);
    update_tx_type_count(cpi, cm, xd, blk_row, blk_col, plane, tx_size,
                         td->counts, allow_update_cdf);

    const TX_CLASS tx_class = tx_type_to_class[tx_type];
    const int16_t *const scan = scan_order->scan;

    // record tx type usage
    td->rd_counts.tx_type_used[tx_size][tx_type]++;

#if CONFIG_ENTROPY_STATS
    update_eob_context(cdf_idx, eob, tx_size, tx_class, plane_type, ec_ctx,
                       td->counts, allow_update_cdf);
#else
    update_eob_context(eob, tx_size, tx_class, plane_type, ec_ctx,
                       allow_update_cdf);
#endif

    DECLARE_ALIGNED(16, int8_t, coeff_contexts[MAX_TX_SQUARE]);
    av1_get_nz_map_contexts(levels, scan, eob, tx_size, tx_class,
                            coeff_contexts);

    for (int c = eob - 1; c >= 0; --c) {
      const int pos = scan[c];
      const int coeff_ctx = coeff_contexts[pos];
      const tran_low_t v = qcoeff[pos];
      const tran_low_t level = abs(v);
      /* abs_sum_level is needed to decide the job scheduling order of
       * pack bitstream multi-threading. This data is not needed if
       * multi-threading is disabled. */
      if (cpi->mt_info.pack_bs_mt_enabled) td->abs_sum_level += level;

      if (allow_update_cdf) {
        if (c == eob - 1) {
          assert(coeff_ctx < 4);
          update_cdf(
              ec_ctx->coeff_base_eob_cdf[txsize_ctx][plane_type][coeff_ctx],
              AOMMIN(level, 3) - 1, 3);
        } else {
          update_cdf(ec_ctx->coeff_base_cdf[txsize_ctx][plane_type][coeff_ctx],
                     AOMMIN(level, 3), 4);
        }
      }
      if (c == eob - 1) {
        assert(coeff_ctx < 4);
#if CONFIG_ENTROPY_STATS
        ++td->counts->coeff_base_eob_multi[cdf_idx][txsize_ctx][plane_type]
                                          [coeff_ctx][AOMMIN(level, 3) - 1];
      } else {
        ++td->counts->coeff_base_multi[cdf_idx][txsize_ctx][plane_type]
                                      [coeff_ctx][AOMMIN(level, 3)];
#endif
      }
      if (level > NUM_BASE_LEVELS) {
        const int base_range = level - 1 - NUM_BASE_LEVELS;
        const int br_ctx = get_br_ctx(levels, pos, bhl, tx_class);
        for (int idx = 0; idx < COEFF_BASE_RANGE; idx += BR_CDF_SIZE - 1) {
          const int k = AOMMIN(base_range - idx, BR_CDF_SIZE - 1);
          if (allow_update_cdf) {
            update_cdf(ec_ctx->coeff_br_cdf[AOMMIN(txsize_ctx, TX_32X32)]
                                           [plane_type][br_ctx],
                       k, BR_CDF_SIZE);
          }
          for (int lps = 0; lps < BR_CDF_SIZE - 1; lps++) {
#if CONFIG_ENTROPY_STATS
            ++td->counts->coeff_lps[AOMMIN(txsize_ctx, TX_32X32)][plane_type]
                                   [lps][br_ctx][lps == k];
#endif  // CONFIG_ENTROPY_STATS
            if (lps == k) break;
          }
#if CONFIG_ENTROPY_STATS
          ++td->counts->coeff_lps_multi[cdf_idx][AOMMIN(txsize_ctx, TX_32X32)]
                                       [plane_type][br_ctx][k];
#endif
          if (k < BR_CDF_SIZE - 1) break;
        }
      }
    }
    // Update the context needed to code the DC sign (if applicable)
    if (tcoeff[0] != 0) {
      const int dc_sign = (tcoeff[0] < 0) ? 1 : 0;
      const int dc_sign_ctx = txb_ctx.dc_sign_ctx;
#if CONFIG_ENTROPY_STATS
      ++td->counts->dc_sign[plane_type][dc_sign_ctx][dc_sign];
#endif  // CONFIG_ENTROPY_STATS
      if (allow_update_cdf)
        update_cdf(ec_ctx->dc_sign_cdf[plane_type][dc_sign_ctx], dc_sign, 2);
      entropy_ctx[block] |= dc_sign_ctx << DC_SIGN_CTX_SHIFT;
    }
  } else {
    tcoeff = qcoeff;
  }
  const uint8_t cul_level =
      av1_get_txb_entropy_context(tcoeff, scan_order, eob);
  av1_set_entropy_contexts(xd, pd, plane, plane_bsize, tx_size, cul_level,
                           blk_col, blk_row);
}